

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
::clear(List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
        *this)

{
  Column_support *this_00;
  _List_node_base *p_Var1;
  
  this_00 = &this->column_;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)this_00) {
    operator_delete(p_Var1[1]._M_next,4);
  }
  std::__cxx11::
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
  ::clear(this_00);
  return;
}

Assistant:

inline void List_column<Master_matrix>::clear()
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Method not available for chain columns as a base element should not be empty.");

  for (auto* entry : column_) {
    if constexpr (Master_matrix::Option_list::has_row_access) RA_opt::unlink(entry);
    entryPool_->destroy(entry);
  }

  column_.clear();
}